

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Token>::initialize<tinyusdz::Token>
          (optional<tinyusdz::Token> *this,Token *value)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  if (this->has_value_ != true) {
    psVar1 = (size_type *)((long)&this->contained + 0x10);
    *(size_type **)&this->contained = psVar1;
    pcVar3 = (value->str_)._M_dataplus._M_p;
    paVar2 = &(value->str_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar2) {
      uVar4 = *(undefined8 *)((long)&(value->str_).field_2 + 8);
      *psVar1 = paVar2->_M_allocated_capacity;
      *(undefined8 *)((long)&this->contained + 0x18) = uVar4;
    }
    else {
      *(pointer *)&this->contained = pcVar3;
      *(size_type *)((long)&this->contained + 0x10) = paVar2->_M_allocated_capacity;
    }
    *(size_type *)((long)&this->contained + 8) = (value->str_)._M_string_length;
    (value->str_)._M_dataplus._M_p = (pointer)paVar2;
    (value->str_)._M_string_length = 0;
    (value->str_).field_2._M_local_buf[0] = '\0';
    this->has_value_ = true;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Token>::initialize(V &&) [T = tinyusdz::Token, V = tinyusdz::Token]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }